

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl_io.cpp
# Opt level: O1

void __thiscall OPLio::OPLshutup(OPLio *this)

{
  int iVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  uint *puVar5;
  ulong uVar6;
  uint which;
  
  if (this->OPLchannels != 0) {
    puVar5 = OPLwriteChannel::op_num;
    uVar6 = 0;
    do {
      uVar4 = uVar6 & 0xffffffff;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar6;
      iVar1 = *(int *)((long)puVar5 +
                      (SUB168(auVar2 * ZEXT816(0xe38e38e38e38e38f),8) >> 1 & 0xfffffffffffffffc) *
                      -9);
      uVar3 = uVar4 / 9;
      (*this->_vptr_OPLio[4])(this,uVar4 / 9,(ulong)(iVar1 + 0x40),0x3f);
      (*this->_vptr_OPLio[4])(this,uVar3,(ulong)(iVar1 + 0x43),0x3f);
      (*this->_vptr_OPLio[4])(this,uVar3,(ulong)(iVar1 + 0x60),0xff);
      (*this->_vptr_OPLio[4])(this,uVar3,(ulong)(iVar1 + 99),0xff);
      (*this->_vptr_OPLio[4])(this,uVar4 / 9,(ulong)(iVar1 + 0x80),0xf);
      (*this->_vptr_OPLio[4])(this,uVar4 / 9,(ulong)(iVar1 + 0x83),0xf);
      (*this->_vptr_OPLio[4])(this,uVar4 / 9,(ulong)((int)uVar6 + (int)(uVar4 / 9) * -9 + 0xb0),0);
      uVar6 = uVar6 + 1;
      puVar5 = puVar5 + 1;
    } while ((uint)uVar6 < this->OPLchannels);
  }
  return;
}

Assistant:

void OPLio::OPLshutup(void)
{
	uint i;

	for(i = 0; i < OPLchannels; i++)
	{
		OPLwriteChannel(0x40, i, 0x3F, 0x3F);	// turn off volume
		OPLwriteChannel(0x60, i, 0xFF, 0xFF);	// the fastest attack, decay
		OPLwriteChannel(0x80, i, 0x0F, 0x0F);	// ... and release
		OPLwriteValue(0xB0, i, 0);		// KEY-OFF
	}
}